

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O3

void Vertical_Sweep_Drop(black_PWorker worker,Short y,FT_F26Dot6 x1,FT_F26Dot6 x2,
                        PProfile_conflict left,PProfile_conflict right)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  lVar5 = (long)worker->precision;
  uVar2 = -lVar5;
  uVar7 = (x1 + lVar5) - 1U & uVar2;
  uVar6 = uVar2 & x2;
  uVar3 = uVar7;
  if ((long)uVar7 <= (long)uVar6) {
    bVar4 = (byte)worker->precision_bits;
    goto LAB_0021540c;
  }
  if (uVar7 != lVar5 + uVar6) {
    return;
  }
  uVar1 = left->flags;
  uVar8 = uVar6;
  switch(uVar1 & 7) {
  case 0:
    break;
  case 1:
  case 5:
    if ((left->next == right) && (left->height < 1)) {
      if ((uVar1 & 0x10) == 0) {
        return;
      }
      if (x2 - x1 < (long)worker->precision_half) {
        return;
      }
    }
    if ((right->next == left) && (left->start == (long)y)) {
      if ((uVar1 & 0x20) == 0) {
        return;
      }
      if (x2 - x1 < (long)worker->precision_half) {
        return;
      }
    }
    if ((uVar1 & 7) != 1) goto switchD_00215343_caseD_4;
    break;
  default:
    return;
  case 4:
switchD_00215343_caseD_4:
    uVar8 = (long)worker->precision_half + (x1 + -1 + x2) / 2 & uVar2;
  }
  bVar4 = (byte)worker->precision_bits;
  if ((-1 < (long)uVar8) && (uVar3 = uVar8, (ulong)worker->bWidth <= uVar8 >> (bVar4 & 0x3f))) {
    uVar3 = uVar6;
  }
  if (uVar3 != uVar7) {
    uVar6 = uVar7;
  }
  uVar6 = (long)uVar6 >> (bVar4 & 0x3f);
  if (((-1 < (long)uVar6) && (uVar6 < worker->bWidth)) &&
     ((char)(worker->bTarget[(uVar6 >> 3) + worker->traceOfs] << ((byte)uVar6 & 7)) < '\0')) {
    return;
  }
LAB_0021540c:
  uVar3 = (long)uVar3 >> (bVar4 & 0x3f);
  if ((-1 < (long)uVar3) && (uVar3 < worker->bWidth)) {
    worker->bTarget[(uVar3 >> 3) + worker->traceOfs] =
         worker->bTarget[(uVar3 >> 3) + worker->traceOfs] | 0x80U >> ((byte)uVar3 & 7);
  }
  return;
}

Assistant:

static void
  Vertical_Sweep_Drop( RAS_ARGS Short       y,
                                FT_F26Dot6  x1,
                                FT_F26Dot6  x2,
                                PProfile    left,
                                PProfile    right )
  {
    Long   e1, e2, pxl;
    Short  c1, f1;


    FT_TRACE7(( "  y=%d x=[%.12f;%.12f]",
                y,
                x1 / (double)ras.precision,
                x2 / (double)ras.precision ));

    /* Drop-out control */

    /*   e2            x2                    x1           e1   */
    /*                                                         */
    /*                 ^                     |                 */
    /*                 |                     |                 */
    /*   +-------------+---------------------+------------+    */
    /*                 |                     |                 */
    /*                 |                     v                 */
    /*                                                         */
    /* pixel         contour              contour       pixel  */
    /* center                                           center */

    /* drop-out mode    scan conversion rules (as defined in OpenType) */
    /* --------------------------------------------------------------- */
    /*  0                1, 2, 3                                       */
    /*  1                1, 2, 4                                       */
    /*  2                1, 2                                          */
    /*  3                same as mode 2                                */
    /*  4                1, 2, 5                                       */
    /*  5                1, 2, 6                                       */
    /*  6, 7             same as mode 2                                */

    e1  = CEILING( x1 );
    e2  = FLOOR  ( x2 );
    pxl = e1;

    if ( e1 > e2 )
    {
      Int  dropOutControl = left->flags & 7;


      FT_TRACE7(( ", drop-out=%d", dropOutControl ));

      if ( e1 == e2 + ras.precision )
      {
        switch ( dropOutControl )
        {
        case 0: /* simple drop-outs including stubs */
          pxl = e2;
          break;

        case 4: /* smart drop-outs including stubs */
          pxl = FLOOR( ( x1 + x2 - 1 ) / 2 + ras.precision_half );
          break;

        case 1: /* simple drop-outs excluding stubs */
        case 5: /* smart drop-outs excluding stubs  */

          /* Drop-out Control Rules #4 and #6 */

          /* The specification neither provides an exact definition */
          /* of a `stub' nor gives exact rules to exclude them.     */
          /*                                                        */
          /* Here the constraints we use to recognize a stub.       */
          /*                                                        */
          /*  upper stub:                                           */
          /*                                                        */
          /*   - P_Left and P_Right are in the same contour         */
          /*   - P_Right is the successor of P_Left in that contour */
          /*   - y is the top of P_Left and P_Right                 */
          /*                                                        */
          /*  lower stub:                                           */
          /*                                                        */
          /*   - P_Left and P_Right are in the same contour         */
          /*   - P_Left is the successor of P_Right in that contour */
          /*   - y is the bottom of P_Left                          */
          /*                                                        */
          /* We draw a stub if the following constraints are met.   */
          /*                                                        */
          /*   - for an upper or lower stub, there is top or bottom */
          /*     overshoot, respectively                            */
          /*   - the covered interval is greater or equal to a half */
          /*     pixel                                              */

          /* upper stub test */
          if ( left->next == right                &&
               left->height <= 0                  &&
               !( left->flags & Overshoot_Top   &&
                  x2 - x1 >= ras.precision_half ) )
            goto Exit;

          /* lower stub test */
          if ( right->next == left                 &&
               left->start == y                    &&
               !( left->flags & Overshoot_Bottom &&
                  x2 - x1 >= ras.precision_half  ) )
            goto Exit;

          if ( dropOutControl == 1 )
            pxl = e2;
          else
            pxl = FLOOR( ( x1 + x2 - 1 ) / 2 + ras.precision_half );
          break;

        default: /* modes 2, 3, 6, 7 */
          goto Exit;  /* no drop-out control */
        }

        /* undocumented but confirmed: If the drop-out would result in a  */
        /* pixel outside of the bounding box, use the pixel inside of the */
        /* bounding box instead                                           */
        if ( pxl < 0 )
          pxl = e1;
        else if ( TRUNC( pxl ) >= ras.bWidth )
          pxl = e2;

        /* check that the other pixel isn't set */
        e1 = ( pxl == e1 ) ? e2 : e1;

        e1 = TRUNC( e1 );

        c1 = (Short)( e1 >> 3 );
        f1 = (Short)( e1 &  7 );

        if ( e1 >= 0 && e1 < ras.bWidth                      &&
             ras.bTarget[ras.traceOfs + c1] & ( 0x80 >> f1 ) )
          goto Exit;
      }
      else
        goto Exit;
    }

    e1 = TRUNC( pxl );

    if ( e1 >= 0 && e1 < ras.bWidth )
    {
      FT_TRACE7(( " -> x=%d (drop-out)", e1 ));

      c1 = (Short)( e1 >> 3 );
      f1 = (Short)( e1 & 7 );

      ras.bTarget[ras.traceOfs + c1] |= (char)( 0x80 >> f1 );
    }

  Exit:
    FT_TRACE7(( "\n" ));
  }